

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashset.cpp
# Opt level: O2

void lsvm::hashset::put(hashset *h,void *val)

{
  uint uVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  uint uVar4;
  equals_fp keyhash;
  uint uVar5;
  equals_fp *pp_Var6;
  equals_fp *pp_Var7;
  uint uVar8;
  uint32_t *puVar9;
  equals_fp *pp_Var10;
  uint32_t *puVar11;
  uint16_t local_40;
  
  keyhash = (equals_fp)(*h->hash)(val);
  uVar4 = (uint)h->bits & (uint)keyhash;
  pp_Var10 = &h[1].equals + uVar4;
  do {
    while( true ) {
      pp_Var10 = (equals_fp *)*pp_Var10;
      if (pp_Var10 == (equals_fp *)0x0) {
        local_40 = (uint16_t)uVar4;
        insert_into_partition(h,(hash)keyhash,local_40,val,true);
        return;
      }
      uVar1 = (&primes)[*(uint *)((long)pp_Var10 + 0xc)];
      uVar5 = (h->range * uVar1) / 100000;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = keyhash;
      pp_Var7 = pp_Var10 + SUB168(auVar2 % ZEXT416(uVar1),0) * 2 + 2;
      if (uVar1 <= uVar5) {
        uVar5 = uVar1 - 1;
      }
      uVar8 = uVar5 + SUB164(auVar2 % ZEXT416(uVar1),0);
      if (uVar8 < uVar1) break;
      puVar11 = (uint32_t *)(pp_Var10 + 2);
      for (; pp_Var7 <= puVar11 + (ulong)(uVar1 - 1) * 4; pp_Var7 = pp_Var7 + 2) {
        if (((*pp_Var7 == keyhash) && (pp_Var7[1] != (equals_fp)0x0)) &&
           (bVar3 = (*h->equals)(val,pp_Var7[1]), bVar3)) goto LAB_0010604e;
      }
      puVar9 = puVar11 + (ulong)(uVar8 - uVar1) * 4;
      for (; puVar11 <= puVar9; puVar11 = puVar11 + 4) {
        if (((*(equals_fp *)puVar11 == keyhash) && (*(void **)(puVar11 + 2) != (void *)0x0)) &&
           (bVar3 = (*h->equals)(val,*(void **)(puVar11 + 2)), bVar3)) {
          *(void **)(puVar11 + 2) = val;
          return;
        }
      }
    }
    pp_Var6 = pp_Var7 + (ulong)uVar5 * 2;
    for (; pp_Var7 <= pp_Var6; pp_Var7 = pp_Var7 + 2) {
      if (((*pp_Var7 == keyhash) && (pp_Var7[1] != (equals_fp)0x0)) &&
         (bVar3 = (*h->equals)(val,pp_Var7[1]), bVar3)) {
LAB_0010604e:
        pp_Var7[1] = (equals_fp)val;
        return;
      }
    }
  } while( true );
}

Assistant:

void put(hashset* h, void* val){
    // calculate hash for a key
    hash keyhash = h->hash(val);
    // calculate bit for a hash
    uint16_t bit = hashbit(keyhash,h->bits);
    // get bit partition bucket
    hashbucket* bp = *partition(h,bit);

    // find key in a bucket using open address and replace it's value
    while(bp != null){
        uint32_t range = entry_range(h,bp);
        uint32_t index = entry_index(bp,keyhash);
        entry* he = get_entry(bp,index);
        const uint32_t bs = bucket_size(bp);
        if(range >= bs) range = bs-1;
        if((index+range) >= bs){
            entry* ehe = get_entry(bp,bs-1);
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    he->val = val;
                    return;
                }
                ++he;
            }
            range = (index+range) - bs;
            he = get_entry(bp,0);
            ehe = he+range;
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    he->val = val;
                    return;
                }
                ++he;
            }
        }else{
            entry* ehe = he + range;
            while(he <= ehe){
                if(he->valhash == keyhash && he->val != null && h->equals(val,he->val)){
                    he->val = val;
                    return;
                }
                ++he;
            }
        }
        bp = bp->next;    
    }

    // if key not found insert it into partition
    insert_into_partition(h,keyhash,bit,val,true);
}